

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void nlohmann::detail::dtoa_impl::grisu2<double>
               (char *buf,int *len,int *decimal_exponent,double value)

{
  diyfp v;
  diyfp m_plus;
  diyfp m_minus;
  boundaries w;
  undefined1 local_50 [32];
  uint64_t local_30;
  int iStack_28;
  undefined4 uStack_24;
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/lib/json.hpp"
                  ,0x2e0f,
                  "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, FloatType) [FloatType = double]"
                 );
  }
  if (0.0 < value) {
    compute_boundaries<double>((boundaries *)local_50,value);
    v._8_8_ = local_50._8_8_;
    v.f = local_50._0_8_;
    m_plus.e = iStack_28;
    m_plus._12_4_ = uStack_24;
    m_plus.f = local_30;
    m_minus._12_4_ = 0;
    m_minus.f = local_50._16_8_;
    m_minus.e = local_50._24_4_;
    grisu2(buf,len,decimal_exponent,m_minus,v,m_plus);
    return;
  }
  __assert_fail("value > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/lib/json.hpp",
                0x2e10,
                "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, FloatType) [FloatType = double]"
               );
}

Assistant:

void grisu2(char* buf, int& len, int& decimal_exponent, FloatType value)
{
    static_assert(diyfp::kPrecision >= std::numeric_limits<FloatType>::digits + 3,
                  "internal error: not enough precision");

    assert(std::isfinite(value));
    assert(value > 0);

    // If the neighbors (and boundaries) of 'value' are always computed for double-precision
    // numbers, all float's can be recovered using strtod (and strtof). However, the resulting
    // decimal representations are not exactly "short".
    //
    // The documentation for 'std::to_chars' (https://en.cppreference.com/w/cpp/utility/to_chars)
    // says "value is converted to a string as if by std::sprintf in the default ("C") locale"
    // and since sprintf promotes float's to double's, I think this is exactly what 'std::to_chars'
    // does.
    // On the other hand, the documentation for 'std::to_chars' requires that "parsing the
    // representation using the corresponding std::from_chars function recovers value exactly". That
    // indicates that single precision floating-point numbers should be recovered using
    // 'std::strtof'.
    //
    // NB: If the neighbors are computed for single-precision numbers, there is a single float
    //     (7.0385307e-26f) which can't be recovered using strtod. The resulting double precision
    //     value is off by 1 ulp.
#if 0
    const boundaries w = compute_boundaries(static_cast<double>(value));
#else
    const boundaries w = compute_boundaries(value);
#endif

    grisu2(buf, len, decimal_exponent, w.minus, w.w, w.plus);
}